

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ProducerIPCClientImpl::NotifyDataSourceStopped
          (ProducerIPCClientImpl *this,DataSourceInstanceID id)

{
  DeferredBase DStack_98;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  NotifyDataSourceStoppedRequest req;
  
  if (this->connected_ == true) {
    protos::gen::NotifyDataSourceStoppedRequest::NotifyDataSourceStoppedRequest(&req);
    protos::gen::NotifyDataSourceStoppedRequest::set_data_source_id(&req,id);
    local_68 = 0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    ipc::Deferred<perfetto::protos::gen::NotifyDataSourceStoppedResponse>::Deferred
              ((Deferred<perfetto::protos::gen::NotifyDataSourceStoppedResponse> *)&DStack_98,
               (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::NotifyDataSourceStoppedResponse>)>
                *)&local_78);
    protos::gen::ProducerPortProxy::NotifyDataSourceStopped
              (&this->producer_port_,&req,(DeferredNotifyDataSourceStoppedResponse *)&DStack_98,-1);
    ipc::DeferredBase::~DeferredBase(&DStack_98);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_78);
    protos::gen::NotifyDataSourceStoppedRequest::~NotifyDataSourceStoppedRequest(&req);
  }
  return;
}

Assistant:

void ProducerIPCClientImpl::NotifyDataSourceStopped(DataSourceInstanceID id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  if (!connected_) {
    PERFETTO_DLOG(
        "Cannot NotifyDataSourceStopped(), not connected to tracing service");
    return;
  }
  protos::gen::NotifyDataSourceStoppedRequest req;
  req.set_data_source_id(id);
  producer_port_.NotifyDataSourceStopped(
      req, ipc::Deferred<protos::gen::NotifyDataSourceStoppedResponse>());
}